

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_dr_flac *
ma_dr_flac_open_with_metadata_private
          (ma_dr_flac_read_proc onRead,ma_dr_flac_seek_proc onSeek,ma_dr_flac_meta_proc onMeta,
          ma_dr_flac_container container,void *pUserData,void *pUserDataMD,
          ma_allocation_callbacks *pAllocationCallbacks)

{
  ushort *puVar1;
  ma_dr_flac_seekpoint *pmVar2;
  uint uVar3;
  ulong uVar4;
  char cVar5;
  byte bVar6;
  ma_bool32 mVar7;
  uint uVar8;
  uint uVar9;
  ma_result mVar10;
  size_t sVar11;
  ma_dr_flac *__src;
  ulong *puVar13;
  ulong *puVar14;
  ma_dr_flac *pFlac;
  int iVar15;
  ulong uVar16;
  uint *puVar17;
  uint *puVar18;
  ulong *puVar19;
  ma_dr_flac_seek_origin extraout_EDX;
  ma_dr_flac_seek_origin extraout_EDX_00;
  ma_dr_flac_seek_origin extraout_EDX_01;
  ma_dr_flac_seek_origin mVar20;
  ulong uVar21;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *extraout_RDX_01;
  uint *extraout_RDX_02;
  ma_uint8 *pNum;
  uint uVar22;
  ulong *puVar23;
  uint uVar24;
  ma_int32 *pmVar25;
  void *__dest;
  long lVar26;
  ma_uint64 mVar27;
  long lVar28;
  ma_dr_flac_seek_proc p_Var29;
  bool bVar30;
  ma_bool32 in_stack_ffffffffffffeca8;
  uint local_134c;
  ulong local_1348;
  ma_dr_flac_seek_proc local_1340;
  ma_allocation_callbacks allocationCallbacks;
  uint local_12f4;
  long local_12f0;
  ulong local_12e0;
  undefined1 local_12d0;
  byte bStack_12cf;
  ushort uStack_12ce;
  ushort uStack_12cc;
  ulong *local_12c8;
  uint local_12c0;
  uint local_12b8;
  uint local_12b4;
  ulong *local_12b0;
  uint local_12a8;
  uint *local_12a0;
  uint local_1298;
  uint local_1294;
  uint local_1290;
  uint local_128c;
  ma_dr_flac_seek_origin local_1288;
  uint *local_1280;
  ulong local_1238;
  uint local_1230;
  byte local_122c;
  ulong *local_1228;
  ma_dr_flac_init_info local_1220;
  ulong uVar12;
  
  if (ma_dr_flac__init_cpu_caps()::isCPUCapsInitialized == '\0') {
    lVar26 = cpuid(0x80000001);
    ma_dr_flac__gIsLZCNTSupported = *(uint *)(lVar26 + 0xc) >> 5 & 1;
    ma_dr_flac__gIsSSE2Supported = 1;
    ma_dr_flac__init_cpu_caps()::isCPUCapsInitialized = '\x01';
  }
  if (onSeek == (ma_dr_flac_seek_proc)0x0 || onRead == (ma_dr_flac_read_proc)0x0) {
    return (ma_dr_flac *)0x0;
  }
  local_1340 = (ma_dr_flac_seek_proc)onMeta;
  memset(&local_1220.container,0,0x11d8);
  local_1220.onMeta = (ma_dr_flac_meta_proc)local_1340;
  local_1220.bs.nextL2Line = 0x200;
  local_1220.bs.consumedBits = 0x40;
  local_1220.bs.unalignedByteCount = 0;
  local_1220.bs.unalignedCache = 0;
  local_1348 = CONCAT44(local_1348._4_4_,(uint)(container != ma_dr_flac_container_unknown));
  local_1220.onRead = onRead;
  local_1220.onSeek = onSeek;
  local_1220.container = container;
  local_1220.pUserData = pUserData;
  local_1220.pUserDataMD = pUserDataMD;
  local_1220.bs.onRead = onRead;
  local_1220.bs.onSeek = onSeek;
  local_1220.bs.pUserData = pUserData;
  while( true ) {
    sVar11 = (*onRead)(pUserData,&allocationCallbacks,4);
    if (sVar11 != 4) {
      return (ma_dr_flac *)0x0;
    }
    local_1220.runningFilePos = local_1220.runningFilePos + 4;
    if ((((char)allocationCallbacks.pUserData != 'I') ||
        (allocationCallbacks.pUserData._1_1_ != 'D')) ||
       (allocationCallbacks.pUserData._2_1_ != '3')) break;
    sVar11 = (*onRead)(pUserData,&local_12d0,6);
    if (sVar11 != 6) {
      return (ma_dr_flac *)0x0;
    }
    local_1220.runningFilePos = local_1220.runningFilePos + 6;
    uVar24 = (((uStack_12cc & 0xff) << 0x10) >> 8 & 0x7f00) >> 1;
    uVar22 = uVar24 + 10;
    if ((bStack_12cf & 0x10) == 0) {
      uVar22 = uVar24;
    }
    uVar22 = uVar22 + (((uStack_12cc & 0x7f00) << 0x10) >> 0x18 | ((uStack_12ce & 0x7f00) << 8) >> 2
                      | ((uStack_12ce & 0x7f) << 0x18) >> 3);
    mVar7 = (*onSeek)(pUserData,uVar22,ma_dr_flac_seek_origin_current);
    if (mVar7 == 0) {
      return (ma_dr_flac *)0x0;
    }
    local_1220.runningFilePos = local_1220.runningFilePos + uVar22;
  }
  if (allocationCallbacks.pUserData._3_1_ == 'C' &&
      (allocationCallbacks.pUserData._2_1_ == 'a' &&
      (allocationCallbacks.pUserData._1_1_ == 'L' && (char)allocationCallbacks.pUserData == 'f'))) {
LAB_001551b3:
    mVar7 = ma_dr_flac__init_private__native
                      (&local_1220,onRead,local_1340,(ma_dr_flac_meta_proc)pUserData,pUserDataMD,
                       (void *)(local_1348 & 0xffffffff),in_stack_ffffffffffffeca8);
  }
  else {
    if (allocationCallbacks.pUserData._3_1_ != 'S' ||
        (allocationCallbacks.pUserData._2_1_ != 'g' ||
        (allocationCallbacks.pUserData._1_1_ != 'g' || (char)allocationCallbacks.pUserData != 'O')))
    {
      if (container == ma_dr_flac_container_unknown) {
        return (ma_dr_flac *)0x0;
      }
      if (container != ma_dr_flac_container_ogg) {
        if (container != ma_dr_flac_container_native) {
          return (ma_dr_flac *)0x0;
        }
        goto LAB_001551b3;
      }
    }
    mVar7 = ma_dr_flac__init_private__ogg
                      (&local_1220,onRead,onSeek,(ma_dr_flac_meta_proc)local_1340,pUserData,
                       pUserDataMD,in_stack_ffffffffffffeca8);
  }
  if (mVar7 == 0) {
    return (ma_dr_flac *)0x0;
  }
  if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
    allocationCallbacks.pUserData = (void *)0x0;
    allocationCallbacks.onMalloc = ma_dr_flac__malloc_default;
    allocationCallbacks.onRealloc = ma_dr_flac__realloc_default;
    allocationCallbacks.onFree = ma_dr_flac__free_default;
  }
  else {
    allocationCallbacks.pUserData = pAllocationCallbacks->pUserData;
    allocationCallbacks.onMalloc = pAllocationCallbacks->onMalloc;
    allocationCallbacks.onRealloc = pAllocationCallbacks->onRealloc;
    allocationCallbacks.onFree = pAllocationCallbacks->onFree;
    if (allocationCallbacks.onFree == (_func_void_void_ptr_void_ptr *)0x0) {
      return (ma_dr_flac *)0x0;
    }
    if (allocationCallbacks.onRealloc == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0 &&
        allocationCallbacks.onMalloc == (_func_void_ptr_size_t_void_ptr *)0x0) {
      return (ma_dr_flac *)0x0;
    }
  }
  uVar22 = (uint)local_1220.channels *
           (((local_1220.maxBlockSizeInPCMFrames >> 4) + 1) -
           (uint)((local_1220.maxBlockSizeInPCMFrames & 0xf) == 0)) * 0x40;
  p_Var29 = (ma_dr_flac_seek_proc)0x0;
  if (local_1220.container == ma_dr_flac_container_ogg) {
    __src = (ma_dr_flac *)ma_dr_flac__malloc_from_callbacks(0x10198,&allocationCallbacks);
    if (__src == (ma_dr_flac *)0x0) {
      return (ma_dr_flac *)0x0;
    }
    local_12f4 = uVar22 + 0x11360;
    memset(&(__src->allocationCallbacks).onFree,0,0x10170);
    __src->onMeta = (ma_dr_flac_meta_proc)onRead;
    __src->pUserDataMD = onSeek;
    (__src->allocationCallbacks).pUserData = pUserData;
    (__src->allocationCallbacks).onMalloc =
         (_func_void_ptr_size_t_void_ptr *)local_1220.oggFirstBytePos;
    (__src->allocationCallbacks).onRealloc =
         (_func_void_ptr_void_ptr_size_t_void_ptr *)local_1220.oggFirstBytePos;
    *(ma_uint32 *)&(__src->allocationCallbacks).onFree = local_1220.oggSerial;
    memcpy(&__src->sampleRate,&local_1220.oggBosHeader,0x120);
  }
  else {
    local_12f4 = uVar22 + 0x11c8;
    __src = (ma_dr_flac *)0x0;
  }
  if (local_1220.hasMetadataBlocks == 0) {
    mVar27 = 0x2a;
    local_12f0 = 0;
  }
  else {
    if (local_1220.container == ma_dr_flac_container_ogg) {
      pUserData = __src;
      onRead = ma_dr_flac__on_read_ogg;
      onSeek = ma_dr_flac__on_seek_ogg;
    }
    mVar27 = 0x2a;
    local_12e0 = 0;
    local_12f0 = 0;
    do {
      sVar11 = (*onRead)(pUserData,&local_134c,4);
      if (sVar11 != 4) goto joined_r0x00155c06;
      uVar24 = local_134c >> 0x18 | (local_134c & 0xff0000) >> 8 | (local_134c & 0xff00) << 8;
      uVar3 = local_134c << 0x18;
      uVar9 = uVar3 & 0x7f000000;
      uVar8 = uVar9 >> 0x18;
      local_12d0 = (undefined1)(uVar9 >> 0x18);
      bStack_12cf = 0;
      uStack_12ce = 0;
      local_12c8 = (ulong *)0x0;
      local_12c0 = 0;
      lVar26 = mVar27 + 4;
      local_1348 = (ulong)uVar24;
      switch(uVar8) {
      case 1:
        if (local_1340 == (ma_dr_flac_seek_proc)0x0) break;
        local_12b8 = 0;
        mVar7 = (*onSeek)(pUserData,uVar24,ma_dr_flac_seek_origin_current);
        if (mVar7 != 0) {
          (*local_1340)(pUserDataMD,(int)&local_12d0,extraout_EDX);
          goto LAB_00155a64;
        }
        goto LAB_00155db3;
      case 2:
        if (uVar24 < 4) goto joined_r0x00155c06;
        if (local_1340 != (ma_dr_flac_seek_proc)0x0) {
          puVar13 = (ulong *)ma_dr_flac__malloc_from_callbacks(local_1348,&allocationCallbacks);
          if (puVar13 != (ulong *)0x0) {
            sVar11 = (*onRead)(pUserData,puVar13,local_1348);
            if (sVar11 == local_1348) {
              uVar9 = (uint)*puVar13;
              local_12b8 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                           uVar9 << 0x18;
              local_12b0 = (ulong *)((long)puVar13 + 4);
              local_12a8 = uVar24 - 4;
              mVar20 = extraout_EDX_01;
LAB_0015590a:
              local_12c8 = puVar13;
              puVar13 = local_12c8;
              local_12c0 = uVar24;
              (*local_1340)(pUserDataMD,(int)&local_12d0,mVar20);
              if (allocationCallbacks.onFree != (_func_void_void_ptr_void_ptr *)0x0) {
                (*allocationCallbacks.onFree)(puVar13,allocationCallbacks.pUserData);
              }
              goto LAB_00155a64;
            }
joined_r0x00155bef:
            if (allocationCallbacks.onFree != (_func_void_void_ptr_void_ptr *)0x0) {
              (*allocationCallbacks.onFree)(puVar13,allocationCallbacks.pUserData);
            }
          }
          goto joined_r0x00155c06;
        }
        break;
      case 3:
        local_12e0 = (ulong)uVar24;
        local_12f0 = lVar26;
        if (local_1340 != (ma_dr_flac_seek_proc)0x0) {
          uVar9 = (uint)((ulong)uVar24 / 0x12);
          puVar14 = (ulong *)ma_dr_flac__malloc_from_callbacks
                                       ((ulong)(uVar9 * 0x18),&allocationCallbacks);
          if (puVar14 == (ulong *)0x0) goto joined_r0x00155c06;
          puVar17 = extraout_RDX;
          for (lVar28 = 0; ((ulong)uVar24 / 0x12) * 0x18 - lVar28 != 0; lVar28 = lVar28 + 0x18) {
            sVar11 = (*onRead)(pUserData,(void *)((long)puVar14 + lVar28),0x12);
            puVar13 = puVar14;
            if (sVar11 != 0x12) goto joined_r0x00155bef;
            uVar16 = *(ulong *)((long)puVar14 + lVar28);
            uVar12 = *(ulong *)((long)puVar14 + lVar28 + 8);
            *(ulong *)((long)puVar14 + lVar28) =
                 uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                 (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                 (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                 (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38;
            *(ulong *)((long)puVar14 + lVar28 + 8) =
                 uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                 (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                 (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                 (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
            puVar1 = (ushort *)((long)puVar14 + lVar28 + 0x10);
            *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            puVar17 = extraout_RDX_00;
          }
          local_12e0 = (ulong)uVar24;
          local_12c8 = puVar14;
          local_12c0 = uVar24;
          local_12b8 = uVar9;
          local_12b0 = puVar14;
LAB_00155a06:
          (*local_1340)(pUserDataMD,(int)&local_12d0,(ma_dr_flac_seek_origin)puVar17);
          if (allocationCallbacks.onFree != (_func_void_void_ptr_void_ptr *)0x0) {
            (*allocationCallbacks.onFree)(puVar14,allocationCallbacks.pUserData);
          }
        }
        break;
      case 4:
        if (uVar24 < 8) goto joined_r0x00155c06;
        if (local_1340 != (ma_dr_flac_seek_proc)0x0) {
          puVar14 = (ulong *)ma_dr_flac__malloc_from_callbacks(local_1348,&allocationCallbacks);
          if (puVar14 != (ulong *)0x0) {
            sVar11 = (*onRead)(pUserData,puVar14,local_1348);
            puVar13 = puVar14;
            if (sVar11 == local_1348) {
              local_12b8 = (uint)*puVar14;
              uVar16 = (ulong)local_12b8;
              local_12c8 = puVar14;
              local_12c0 = uVar24;
              if (uVar16 <= local_1348 - 8) {
                local_12b0 = (ulong *)((long)puVar14 + 4);
                local_12a8 = *(uint *)((long)puVar14 + uVar16 + 4);
                uVar12 = (ulong)local_12a8;
                puVar18 = (uint *)((long)puVar14 + uVar16 + 8);
                puVar17 = puVar18;
                if (uVar12 <= (long)puVar14 + (local_1348 - (long)puVar18) >> 2) {
                  while (iVar15 = (int)uVar12, uVar12 = (ulong)(iVar15 - 1), local_12a0 = puVar18,
                        iVar15 != 0) {
                    if ((long)((long)puVar14 + (local_1348 - (long)puVar17)) < 4)
                    goto joined_r0x00155bef;
                    if ((long)((long)puVar14 + (local_1348 - (long)(puVar17 + 1))) <
                        (long)(ulong)*puVar17) goto joined_r0x00155bef;
                    puVar17 = (uint *)((long)(puVar17 + 1) + (ulong)*puVar17);
                  }
                  goto LAB_00155a06;
                }
              }
            }
            goto joined_r0x00155bef;
          }
          goto joined_r0x00155c06;
        }
        break;
      case 5:
        if (uVar24 < 0x18c) goto joined_r0x00155c06;
        if (local_1340 != (ma_dr_flac_seek_proc)0x0) {
          puVar13 = (ulong *)ma_dr_flac__malloc_from_callbacks(local_1348,&allocationCallbacks);
          if (puVar13 != (ulong *)0x0) {
            sVar11 = (*onRead)(pUserData,puVar13,local_1348);
            uVar16 = local_1348;
            if (sVar11 == local_1348) {
              local_12c8 = puVar13;
              local_12c0 = uVar24;
              memcpy(&local_12b8,puVar13,0x80);
              uVar12 = puVar13[0x10];
              local_1238 = uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                           (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                           (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                           (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
              local_1230 = (uint)(byte)((byte)puVar13[0x11] >> 7);
              local_122c = *(byte *)((long)puVar13 + 0x18b);
              uVar12 = (ulong)local_122c;
              local_1228 = (ulong *)0x0;
              puVar23 = (ulong *)((long)puVar13 + 0x18c);
              sVar11 = uVar12 * 0x24;
              puVar14 = puVar23;
              while (cVar5 = (char)uVar12, uVar12 = (ulong)(byte)(cVar5 - 1), cVar5 != '\0') {
                if ((long)((long)puVar13 + (uVar16 - (long)puVar14)) < 0x24)
                goto joined_r0x00155bef;
                uVar21 = (ulong)*(byte *)((long)puVar14 + 0x23);
                lVar28 = (long)puVar13 + (uVar16 - ((long)puVar14 + 0x24));
                if (SBORROW8(lVar28,uVar21 * 0xc) != (long)(lVar28 + uVar21 * -0xc) < 0)
                goto joined_r0x00155bef;
                sVar11 = sVar11 + (ulong)*(byte *)((long)puVar14 + 0x23) * 0x10;
                puVar14 = (ulong *)((uint *)((long)puVar14 + 0x24) + uVar21 * 3);
              }
              puVar14 = (ulong *)ma_dr_flac__malloc_from_callbacks(sVar11,&allocationCallbacks);
              if (puVar14 != (ulong *)0x0) {
                puVar19 = puVar14;
                puVar17 = extraout_RDX_01;
                for (bVar6 = 0; bVar6 < local_122c; bVar6 = bVar6 + 1) {
                  uVar4 = puVar23[4];
                  *(uint *)(puVar19 + 4) = (uint)uVar4;
                  uVar16 = *puVar23;
                  uVar12 = puVar23[1];
                  uVar21 = puVar23[3];
                  puVar19[2] = puVar23[2];
                  puVar19[3] = uVar21;
                  *puVar19 = uVar16;
                  puVar19[1] = uVar12;
                  puVar17 = (uint *)(ulong)CONCAT31((int3)((uint)uVar4 >> 8),
                                                    *(undefined1 *)((long)puVar23 + 0x23));
                  puVar23 = (ulong *)((long)puVar23 + 0x24);
                  puVar19 = (ulong *)((long)puVar19 + 0x24);
                  while (cVar5 = (char)puVar17,
                        puVar17 = (uint *)CONCAT71((int7)((ulong)puVar17 >> 8),cVar5 + -1),
                        cVar5 != '\0') {
                    uVar16 = *puVar23;
                    *puVar19 = uVar16;
                    *(uint *)(puVar19 + 1) = (uint)puVar23[1];
                    puVar23 = (ulong *)((long)puVar23 + 0xc);
                    *puVar19 = uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                               (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                               (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                               (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38;
                    puVar19 = puVar19 + 2;
                  }
                }
                local_1228 = puVar14;
                if (allocationCallbacks.onFree != (_func_void_void_ptr_void_ptr *)0x0) {
                  (*allocationCallbacks.onFree)(puVar13,allocationCallbacks.pUserData);
                  puVar17 = extraout_RDX_02;
                }
                goto LAB_00155a06;
              }
            }
            goto joined_r0x00155bef;
          }
          goto joined_r0x00155c06;
        }
        break;
      case 6:
        if (uVar24 < 0x20) goto joined_r0x00155c06;
        if (local_1340 != (ma_dr_flac_seek_proc)0x0) {
          puVar13 = (ulong *)ma_dr_flac__malloc_from_callbacks(local_1348,&allocationCallbacks);
          if (puVar13 != (ulong *)0x0) {
            sVar11 = (*onRead)(pUserData,puVar13,local_1348);
            if (sVar11 == local_1348) {
              uVar9 = (uint)*puVar13;
              local_12b8 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                           uVar9 << 0x18;
              uVar9 = *(uint *)((long)puVar13 + 4);
              local_12b4 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                           uVar9 << 0x18;
              uVar16 = (ulong)local_12b4;
              local_12c8 = puVar13;
              local_12c0 = uVar24;
              if (uVar16 <= local_1348 - 0x20) {
                local_12b0 = puVar13 + 1;
                uVar9 = *(uint *)((long)puVar13 + uVar16 + 8);
                local_12a8 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                             uVar9 << 0x18;
                puVar17 = (uint *)((long)puVar13 + uVar16 + 0xc);
                if ((long)(ulong)local_12a8 <=
                    (long)((long)puVar13 + (local_1348 - (long)puVar17) + -0x14)) {
                  puVar18 = (uint *)((long)puVar17 + (ulong)local_12a8);
                  local_1280 = puVar18 + 5;
                  uVar9 = *puVar18;
                  local_1298 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                               uVar9 << 0x18;
                  uVar9 = puVar18[1];
                  local_1294 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                               uVar9 << 0x18;
                  uVar9 = puVar18[2];
                  local_1290 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                               uVar9 << 0x18;
                  uVar9 = puVar18[3];
                  local_128c = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                               uVar9 << 0x18;
                  uVar9 = puVar18[4];
                  mVar20 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                           uVar9 << 0x18;
                  local_12a0 = puVar17;
                  local_1288 = mVar20;
                  if ((long)(ulong)mVar20 <= (long)((long)puVar13 + (local_1348 - (long)local_1280))
                     ) goto LAB_0015590a;
                }
              }
            }
            goto joined_r0x00155bef;
          }
          goto joined_r0x00155c06;
        }
        break;
      default:
        if (uVar8 == 0x7f) {
          if (local_1340 == (ma_dr_flac_seek_proc)0x0) break;
          goto LAB_00155a4b;
        }
        if (local_1340 == (ma_dr_flac_seek_proc)0x0) break;
        puVar13 = (ulong *)ma_dr_flac__malloc_from_callbacks(local_1348,&allocationCallbacks);
        if (puVar13 != (ulong *)0x0) {
          sVar11 = (*onRead)(pUserData,puVar13,local_1348);
          mVar20 = extraout_EDX_00;
          if (sVar11 == local_1348) goto LAB_0015590a;
          goto joined_r0x00155bef;
        }
        goto joined_r0x00155c06;
      }
      if (uVar24 != 0 && local_1340 == (ma_dr_flac_seek_proc)0x0) {
LAB_00155a4b:
        mVar7 = (*onSeek)(pUserData,uVar24,ma_dr_flac_seek_origin_current);
        if (mVar7 == 0) {
LAB_00155db3:
          mVar27 = lVar26 + local_1348;
          break;
        }
      }
LAB_00155a64:
      mVar27 = lVar26 + local_1348;
    } while (-1 < (int)(uVar24 | uVar3));
    p_Var29 = (ma_dr_flac_seek_proc)(local_12e0 / 0x12);
    local_12f4 = local_12f4 + (int)p_Var29 * 0x18;
  }
  pFlac = (ma_dr_flac *)ma_dr_flac__malloc_from_callbacks((ulong)local_12f4,&allocationCallbacks);
  if (pFlac == (ma_dr_flac *)0x0) {
joined_r0x00155c06:
    pFlac = __src;
    if (__src == (ma_dr_flac *)0x0) {
      return (ma_dr_flac *)0x0;
    }
    goto joined_r0x00155c14;
  }
  memset(pFlac,0,0x1188);
  memcpy(&pFlac->bs,&local_1220.bs,0x1050);
  pFlac->onMeta = local_1220.onMeta;
  pFlac->pUserDataMD = local_1220.pUserDataMD;
  pFlac->maxBlockSizeInPCMFrames = local_1220.maxBlockSizeInPCMFrames;
  pFlac->sampleRate = local_1220.sampleRate;
  pFlac->channels = local_1220.channels;
  pFlac->bitsPerSample = local_1220.bitsPerSample;
  pFlac->totalPCMFrameCount = local_1220.totalPCMFrameCount;
  pFlac->container = local_1220.container;
  (pFlac->allocationCallbacks).onRealloc = allocationCallbacks.onRealloc;
  (pFlac->allocationCallbacks).onFree = allocationCallbacks.onFree;
  (pFlac->allocationCallbacks).pUserData = allocationCallbacks.pUserData;
  (pFlac->allocationCallbacks).onMalloc = allocationCallbacks.onMalloc;
  pmVar25 = (ma_int32 *)((ulong)((long)&pFlac[1].maxBlockSizeInPCMFrames + 1U) & 0xffffffffffffffc0)
  ;
  pFlac->pDecodedSamples = pmVar25;
  local_1340 = p_Var29;
  if (local_1220.container == ma_dr_flac_container_ogg) {
    __dest = (void *)((long)pmVar25 + (long)p_Var29 * 0x18 + (ulong)uVar22);
    memcpy(__dest,__src,0x10198);
    if (allocationCallbacks.onFree == (_func_void_void_ptr_void_ptr *)0x0) {
      bVar30 = true;
    }
    else {
      (*allocationCallbacks.onFree)(__src,allocationCallbacks.pUserData);
      bVar30 = local_1220.container == ma_dr_flac_container_ogg;
    }
    (pFlac->bs).onRead = ma_dr_flac__on_read_ogg;
    (pFlac->bs).onSeek = ma_dr_flac__on_seek_ogg;
    (pFlac->bs).pUserData = __dest;
    pFlac->_oggbs = __dest;
    pFlac->firstFLACFramePosInBytes = mVar27;
    if (!bVar30) goto LAB_00155c6c;
    pFlac->pSeekpoints = (ma_dr_flac_seekpoint *)0x0;
LAB_00155d0b:
    pFlac->seekpointCount = 0;
  }
  else {
    pFlac->firstFLACFramePosInBytes = mVar27;
LAB_00155c6c:
    if (local_12f0 != 0) {
      pFlac->seekpointCount = (ma_uint32)p_Var29;
      pFlac->pSeekpoints = (ma_dr_flac_seekpoint *)((ulong)uVar22 + (long)pFlac->pDecodedSamples);
      mVar7 = (*(pFlac->bs).onSeek)
                        ((pFlac->bs).pUserData,(int)local_12f0,ma_dr_flac_seek_origin_start);
      if (mVar7 == 0) {
        pFlac->pSeekpoints = (ma_dr_flac_seekpoint *)0x0;
        goto LAB_00155d0b;
      }
      lVar26 = (long)local_1340 * 0x18;
      for (lVar28 = 0; lVar26 - lVar28 != 0; lVar28 = lVar28 + 0x18) {
        sVar11 = (*(pFlac->bs).onRead)
                           ((pFlac->bs).pUserData,
                            (void *)((long)&pFlac->pSeekpoints->firstPCMFrame + lVar28),0x12);
        if (sVar11 != 0x12) {
          pFlac->pSeekpoints = (ma_dr_flac_seekpoint *)0x0;
          pFlac->seekpointCount = 0;
          break;
        }
        pmVar2 = pFlac->pSeekpoints;
        uVar16 = *(ulong *)((long)&pmVar2->firstPCMFrame + lVar28);
        uVar12 = *(ulong *)((long)&pmVar2->flacFrameOffset + lVar28);
        *(ulong *)((long)&pmVar2->firstPCMFrame + lVar28) =
             uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
             (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
             (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 | (uVar16 & 0xff00) << 0x28 |
             uVar16 << 0x38;
        *(ulong *)((long)&pmVar2->flacFrameOffset + lVar28) =
             uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
             (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
             (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 | (uVar12 & 0xff00) << 0x28 |
             uVar12 << 0x38;
        puVar1 = (ushort *)((long)&pmVar2->pcmFrameCount + lVar28);
        *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      }
      mVar7 = (*(pFlac->bs).onSeek)
                        ((pFlac->bs).pUserData,(int)pFlac->firstFLACFramePosInBytes,
                         ma_dr_flac_seek_origin_start);
      if (mVar7 == 0) goto joined_r0x00155c14;
    }
  }
  if (local_1220.hasStreamInfoBlock != 0) {
    return pFlac;
  }
  (pFlac->currentFLACFrame).header.blockSizeInPCMFrames =
       local_1220.firstFrameHeader.blockSizeInPCMFrames;
  (pFlac->currentFLACFrame).header.channelAssignment = local_1220.firstFrameHeader.channelAssignment
  ;
  (pFlac->currentFLACFrame).header.bitsPerSample = local_1220.firstFrameHeader.bitsPerSample;
  (pFlac->currentFLACFrame).header.crc8 = local_1220.firstFrameHeader.crc8;
  *(undefined3 *)&(pFlac->currentFLACFrame).header.field_0x15 = local_1220.firstFrameHeader._21_3_;
  (pFlac->currentFLACFrame).header.pcmFrameNumber = local_1220.firstFrameHeader.pcmFrameNumber;
  (pFlac->currentFLACFrame).header.flacFrameNumber = local_1220.firstFrameHeader.flacFrameNumber;
  (pFlac->currentFLACFrame).header.sampleRate = local_1220.firstFrameHeader.sampleRate;
  do {
    mVar10 = ma_dr_flac__decode_flac_frame(pFlac);
    if (mVar10 != MA_CRC_MISMATCH) {
      if (mVar10 == MA_SUCCESS) {
        return pFlac;
      }
      break;
    }
    mVar7 = ma_dr_flac__read_next_flac_frame_header
                      (&pFlac->bs,pFlac->bitsPerSample,&(pFlac->currentFLACFrame).header);
  } while (mVar7 != 0);
joined_r0x00155c14:
  if (allocationCallbacks.onFree != (_func_void_void_ptr_void_ptr *)0x0) {
    (*allocationCallbacks.onFree)(pFlac,allocationCallbacks.pUserData);
  }
  return (ma_dr_flac *)0x0;
}

Assistant:

static ma_dr_flac* ma_dr_flac_open_with_metadata_private(ma_dr_flac_read_proc onRead, ma_dr_flac_seek_proc onSeek, ma_dr_flac_meta_proc onMeta, ma_dr_flac_container container, void* pUserData, void* pUserDataMD, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_dr_flac_init_info init;
    ma_uint32 allocationSize;
    ma_uint32 wholeSIMDVectorCountPerChannel;
    ma_uint32 decodedSamplesAllocationSize;
#ifndef MA_DR_FLAC_NO_OGG
    ma_dr_flac_oggbs* pOggbs = NULL;
#endif
    ma_uint64 firstFramePos;
    ma_uint64 seektablePos;
    ma_uint32 seekpointCount;
    ma_allocation_callbacks allocationCallbacks;
    ma_dr_flac* pFlac;
    ma_dr_flac__init_cpu_caps();
    if (!ma_dr_flac__init_private(&init, onRead, onSeek, onMeta, container, pUserData, pUserDataMD)) {
        return NULL;
    }
    if (pAllocationCallbacks != NULL) {
        allocationCallbacks = *pAllocationCallbacks;
        if (allocationCallbacks.onFree == NULL || (allocationCallbacks.onMalloc == NULL && allocationCallbacks.onRealloc == NULL)) {
            return NULL;
        }
    } else {
        allocationCallbacks.pUserData = NULL;
        allocationCallbacks.onMalloc  = ma_dr_flac__malloc_default;
        allocationCallbacks.onRealloc = ma_dr_flac__realloc_default;
        allocationCallbacks.onFree    = ma_dr_flac__free_default;
    }
    allocationSize = sizeof(ma_dr_flac);
    if ((init.maxBlockSizeInPCMFrames % (MA_DR_FLAC_MAX_SIMD_VECTOR_SIZE / sizeof(ma_int32))) == 0) {
        wholeSIMDVectorCountPerChannel = (init.maxBlockSizeInPCMFrames / (MA_DR_FLAC_MAX_SIMD_VECTOR_SIZE / sizeof(ma_int32)));
    } else {
        wholeSIMDVectorCountPerChannel = (init.maxBlockSizeInPCMFrames / (MA_DR_FLAC_MAX_SIMD_VECTOR_SIZE / sizeof(ma_int32))) + 1;
    }
    decodedSamplesAllocationSize = wholeSIMDVectorCountPerChannel * MA_DR_FLAC_MAX_SIMD_VECTOR_SIZE * init.channels;
    allocationSize += decodedSamplesAllocationSize;
    allocationSize += MA_DR_FLAC_MAX_SIMD_VECTOR_SIZE;
#ifndef MA_DR_FLAC_NO_OGG
    if (init.container == ma_dr_flac_container_ogg) {
        allocationSize += sizeof(ma_dr_flac_oggbs);
        pOggbs = (ma_dr_flac_oggbs*)ma_dr_flac__malloc_from_callbacks(sizeof(*pOggbs), &allocationCallbacks);
        if (pOggbs == NULL) {
            return NULL;
        }
        MA_DR_FLAC_ZERO_MEMORY(pOggbs, sizeof(*pOggbs));
        pOggbs->onRead = onRead;
        pOggbs->onSeek = onSeek;
        pOggbs->pUserData = pUserData;
        pOggbs->currentBytePos = init.oggFirstBytePos;
        pOggbs->firstBytePos = init.oggFirstBytePos;
        pOggbs->serialNumber = init.oggSerial;
        pOggbs->bosPageHeader = init.oggBosHeader;
        pOggbs->bytesRemainingInPage = 0;
    }
#endif
    firstFramePos  = 42;
    seektablePos   = 0;
    seekpointCount = 0;
    if (init.hasMetadataBlocks) {
        ma_dr_flac_read_proc onReadOverride = onRead;
        ma_dr_flac_seek_proc onSeekOverride = onSeek;
        void* pUserDataOverride = pUserData;
#ifndef MA_DR_FLAC_NO_OGG
        if (init.container == ma_dr_flac_container_ogg) {
            onReadOverride = ma_dr_flac__on_read_ogg;
            onSeekOverride = ma_dr_flac__on_seek_ogg;
            pUserDataOverride = (void*)pOggbs;
        }
#endif
        if (!ma_dr_flac__read_and_decode_metadata(onReadOverride, onSeekOverride, onMeta, pUserDataOverride, pUserDataMD, &firstFramePos, &seektablePos, &seekpointCount, &allocationCallbacks)) {
        #ifndef MA_DR_FLAC_NO_OGG
            ma_dr_flac__free_from_callbacks(pOggbs, &allocationCallbacks);
        #endif
            return NULL;
        }
        allocationSize += seekpointCount * sizeof(ma_dr_flac_seekpoint);
    }
    pFlac = (ma_dr_flac*)ma_dr_flac__malloc_from_callbacks(allocationSize, &allocationCallbacks);
    if (pFlac == NULL) {
    #ifndef MA_DR_FLAC_NO_OGG
        ma_dr_flac__free_from_callbacks(pOggbs, &allocationCallbacks);
    #endif
        return NULL;
    }
    ma_dr_flac__init_from_info(pFlac, &init);
    pFlac->allocationCallbacks = allocationCallbacks;
    pFlac->pDecodedSamples = (ma_int32*)ma_dr_flac_align((size_t)pFlac->pExtraData, MA_DR_FLAC_MAX_SIMD_VECTOR_SIZE);
#ifndef MA_DR_FLAC_NO_OGG
    if (init.container == ma_dr_flac_container_ogg) {
        ma_dr_flac_oggbs* pInternalOggbs = (ma_dr_flac_oggbs*)((ma_uint8*)pFlac->pDecodedSamples + decodedSamplesAllocationSize + (seekpointCount * sizeof(ma_dr_flac_seekpoint)));
        MA_DR_FLAC_COPY_MEMORY(pInternalOggbs, pOggbs, sizeof(*pOggbs));
        ma_dr_flac__free_from_callbacks(pOggbs, &allocationCallbacks);
        pOggbs = NULL;
        pFlac->bs.onRead = ma_dr_flac__on_read_ogg;
        pFlac->bs.onSeek = ma_dr_flac__on_seek_ogg;
        pFlac->bs.pUserData = (void*)pInternalOggbs;
        pFlac->_oggbs = (void*)pInternalOggbs;
    }
#endif
    pFlac->firstFLACFramePosInBytes = firstFramePos;
#ifndef MA_DR_FLAC_NO_OGG
    if (init.container == ma_dr_flac_container_ogg)
    {
        pFlac->pSeekpoints = NULL;
        pFlac->seekpointCount = 0;
    }
    else
#endif
    {
        if (seektablePos != 0) {
            pFlac->seekpointCount = seekpointCount;
            pFlac->pSeekpoints = (ma_dr_flac_seekpoint*)((ma_uint8*)pFlac->pDecodedSamples + decodedSamplesAllocationSize);
            MA_DR_FLAC_ASSERT(pFlac->bs.onSeek != NULL);
            MA_DR_FLAC_ASSERT(pFlac->bs.onRead != NULL);
            if (pFlac->bs.onSeek(pFlac->bs.pUserData, (int)seektablePos, ma_dr_flac_seek_origin_start)) {
                ma_uint32 iSeekpoint;
                for (iSeekpoint = 0; iSeekpoint < seekpointCount; iSeekpoint += 1) {
                    if (pFlac->bs.onRead(pFlac->bs.pUserData, pFlac->pSeekpoints + iSeekpoint, MA_DR_FLAC_SEEKPOINT_SIZE_IN_BYTES) == MA_DR_FLAC_SEEKPOINT_SIZE_IN_BYTES) {
                        pFlac->pSeekpoints[iSeekpoint].firstPCMFrame   = ma_dr_flac__be2host_64(pFlac->pSeekpoints[iSeekpoint].firstPCMFrame);
                        pFlac->pSeekpoints[iSeekpoint].flacFrameOffset = ma_dr_flac__be2host_64(pFlac->pSeekpoints[iSeekpoint].flacFrameOffset);
                        pFlac->pSeekpoints[iSeekpoint].pcmFrameCount   = ma_dr_flac__be2host_16(pFlac->pSeekpoints[iSeekpoint].pcmFrameCount);
                    } else {
                        pFlac->pSeekpoints = NULL;
                        pFlac->seekpointCount = 0;
                        break;
                    }
                }
                if (!pFlac->bs.onSeek(pFlac->bs.pUserData, (int)pFlac->firstFLACFramePosInBytes, ma_dr_flac_seek_origin_start)) {
                    ma_dr_flac__free_from_callbacks(pFlac, &allocationCallbacks);
                    return NULL;
                }
            } else {
                pFlac->pSeekpoints = NULL;
                pFlac->seekpointCount = 0;
            }
        }
    }
    if (!init.hasStreamInfoBlock) {
        pFlac->currentFLACFrame.header = init.firstFrameHeader;
        for (;;) {
            ma_result result = ma_dr_flac__decode_flac_frame(pFlac);
            if (result == MA_SUCCESS) {
                break;
            } else {
                if (result == MA_CRC_MISMATCH) {
                    if (!ma_dr_flac__read_next_flac_frame_header(&pFlac->bs, pFlac->bitsPerSample, &pFlac->currentFLACFrame.header)) {
                        ma_dr_flac__free_from_callbacks(pFlac, &allocationCallbacks);
                        return NULL;
                    }
                    continue;
                } else {
                    ma_dr_flac__free_from_callbacks(pFlac, &allocationCallbacks);
                    return NULL;
                }
            }
        }
    }
    return pFlac;
}